

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::ChooseRenderPassAndFramebuffer(DeviceContextVkImpl *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  TextureViewVkImpl *pTVar4;
  VkImageView pVVar5;
  long lVar6;
  Char *pCVar7;
  RenderDeviceVkImpl *pRVar8;
  FramebufferCache *this_00;
  RenderPassCache *this_01;
  RenderPassVkImpl *this_02;
  VkRenderPass pVVar9;
  VkFramebuffer pVVar10;
  ITexture *pIVar11;
  undefined4 extraout_var_00;
  TextureFormatAttribs *pTVar12;
  TextureViewDesc *pTVar13;
  ITextureView *pIVar14;
  undefined4 extraout_var_01;
  pointer this_03;
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  string msg_2;
  TextureDesc *ShadingRateDesc;
  TextureFormatAttribs *FmtAttribs;
  TEXTURE_FORMAT DepthStencilFmt;
  undefined1 local_144 [8];
  CreateDyanmicRenderInfoAttribs CreateRIAttribs;
  string msg_1;
  RenderPassVkImpl *pRenderPass;
  RenderPassCache *RPCache;
  FramebufferCache *FBCache;
  undefined1 local_e0 [8];
  string msg;
  ITexture *pRenderTarget;
  TextureViewVkImpl *pRTVVk;
  Uint32 rt;
  ITexture *pDepthBuffer;
  RenderPassCacheKey RenderPassKey;
  FramebufferCacheKey FBKey;
  DeviceContextVkImpl *this_local;
  
  FBKey.Hash = (size_t)this;
  FramebufferCache::FramebufferCacheKey::FramebufferCacheKey
            ((FramebufferCacheKey *)&RenderPassKey.Hash);
  RenderPassCache::RenderPassCacheKey::RenderPassCacheKey((RenderPassCacheKey *)&pDepthBuffer);
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil);
  if (bVar1) {
    pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pIVar11 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                        (&pTVar4->super_TextureViewBase<Diligent::EngineVkImplTraits>);
    pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    FBKey._8_8_ = TextureViewVkImpl::GetVulkanImageView(pTVar4);
    pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar13 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         *)pTVar4);
    pDepthBuffer._4_2_ = pTVar13->Format;
    pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar13 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         *)pTVar4);
    pDepthBuffer._3_1_ = pTVar13->ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
    iVar3 = (*(pIVar11->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    pDepthBuffer._1_1_ = (byte)*(undefined4 *)(CONCAT44(extraout_var,iVar3) + 0x20);
  }
  else {
    FBKey.NumRenderTargets = 0;
    FBKey._12_4_ = 0;
    pDepthBuffer._4_2_ = TEX_FORMAT_UNKNOWN;
  }
  FBKey.Pass._0_4_ =
       (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  pDepthBuffer._0_1_ =
       (undefined1)
       (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  for (pRTVVk._4_4_ = 0;
      pRTVVk._4_4_ <
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
      pRTVVk._4_4_ = pRTVVk._4_4_ + 1) {
    pTVar4 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                       ((RefCntAutoPtr *)
                        ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets
                        + pRTVVk._4_4_));
    if (pTVar4 == (TextureViewVkImpl *)0x0) {
      FBKey.RTVs[(ulong)pRTVVk._4_4_ - 1] = (VkImageView)0x0;
      RenderPassKey.RTVFormats[(ulong)pRTVVk._4_4_ - 4] = TEX_FORMAT_UNKNOWN;
    }
    else {
      msg.field_2._8_8_ =
           TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                     (&pTVar4->super_TextureViewBase<Diligent::EngineVkImplTraits>);
      pVVar5 = TextureViewVkImpl::GetVulkanImageView(pTVar4);
      FBKey.RTVs[(ulong)pRTVVk._4_4_ - 1] = pVVar5;
      lVar6 = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
      RenderPassKey.RTVFormats[(ulong)pRTVVk._4_4_ - 4] = *(TEXTURE_FORMAT *)(lVar6 + 0x18);
      if (pDepthBuffer._1_1_ == 0) {
        lVar6 = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
        pDepthBuffer._1_1_ = (byte)*(undefined4 *)(lVar6 + 0x20);
      }
      else {
        uVar2 = (uint)pDepthBuffer._1_1_;
        lVar6 = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
        if (uVar2 != *(uint *)(lVar6 + 0x20)) {
          FormatString<char[26]>((string *)local_e0,(char (*) [26])"Inconsistent sample count");
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"ChooseRenderPassAndFramebuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x767);
          std::__cxx11::string::~string((string *)local_e0);
        }
      }
    }
  }
  if (pDepthBuffer._1_1_ == 0) {
    pDepthBuffer._1_1_ =
         (byte)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples;
  }
  pDepthBuffer._2_1_ =
       Diligent::RefCntAutoPtr::operator_cast_to_bool
                 ((RefCntAutoPtr *)
                  &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                   super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap);
  if ((bool)pDepthBuffer._2_1_) {
    pTVar4 = RefCntAutoPtr<Diligent::ITextureView>::RawPtr<Diligent::TextureViewVkImpl>
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                         m_pBoundShadingRateMap);
    FBKey.RTVs[7] = TextureViewVkImpl::GetVulkanImageView(pTVar4);
  }
  else {
    FBKey.RTVs[7] = (VkImageView)0x0;
  }
  pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_00 = RenderDeviceVkImpl::GetFramebufferCache(pRVar8);
  pRVar8 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                     (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_01 = RenderDeviceVkImpl::GetImplicitRenderPassCache(pRVar8);
  if ((this_00 == (FramebufferCache *)0x0) || (this_01 == (RenderPassCache *)0x0)) {
    FramebufferCache::CreateDyanmicRenderInfoAttribs::CreateDyanmicRenderInfoAttribs
              ((CreateDyanmicRenderInfoAttribs *)local_144);
    local_144._0_4_ =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
    local_144._4_4_ =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
    CreateRIAttribs.Extent.width =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices;
    CreateRIAttribs.Extent.height = 0;
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                      ((RefCntAutoPtr *)
                       &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil);
    if (bVar1) {
      pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                           m_pBoundDepthStencil);
      pIVar11 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                          (&pTVar4->super_TextureViewBase<Diligent::EngineVkImplTraits>);
      iVar3 = (*(pIVar11->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      pTVar12 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(CONCAT44(extraout_var_00,iVar3) + 0x18))
      ;
      CreateRIAttribs.ShadingRateTexelSize.width._0_1_ = 1;
      CreateRIAttribs.ShadingRateTexelSize.width._1_1_ =
           pTVar12->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
      pTVar4 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                           m_pBoundDepthStencil);
      pTVar13 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                           *)pTVar4);
      CreateRIAttribs.ShadingRateTexelSize.width._2_1_ =
           pTVar13->ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
    }
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                      ((RefCntAutoPtr *)
                       &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap
                      );
    if (bVar1) {
      pIVar14 = RefCntAutoPtr<Diligent::ITextureView>::operator->
                          (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                            m_pBoundShadingRateMap);
      iVar3 = (*(pIVar14->super_IDeviceObject).super_IObject._vptr_IObject[10])();
      msg_2.field_2._8_8_ = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x20))();
      CreateRIAttribs.Layers =
           AlignUpToPowerOfTwo<unsigned_int>
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth /
                      *(uint *)(msg_2.field_2._8_8_ + 0xc));
      CreateRIAttribs.ViewMask =
           AlignUpToPowerOfTwo<unsigned_int>
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight /
                      *(uint *)(msg_2.field_2._8_8_ + 0x10));
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_DynamicRenderingInfo);
    if (bVar1) {
      this_03 = std::
                unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                ::operator->(&this->m_DynamicRenderingInfo);
      bVar1 = VulkanUtilities::RenderingInfoWrapper::HasClears(this_03);
      if (bVar1) {
        FormatString<char[52]>
                  ((string *)local_180,
                   (char (*) [52])"There are pending clears in the dynamic render pass");
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"ChooseRenderPassAndFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x7aa);
        std::__cxx11::string::~string((string *)local_180);
      }
    }
    FramebufferCache::CreateDyanmicRenderInfo
              ((FramebufferCache *)local_188,(FramebufferCacheKey *)&RenderPassKey.Hash,
               (CreateDyanmicRenderInfoAttribs *)local_144);
    std::
    unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ::operator=(&this->m_DynamicRenderingInfo,
                (unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                 *)local_188);
    std::
    unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ::~unique_ptr((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   *)local_188);
  }
  else {
    this_02 = RenderPassCache::GetRenderPass(this_01,(RenderPassCacheKey *)&pDepthBuffer);
    if (this_02 == (RenderPassVkImpl *)0x0) {
      FormatString<char[65]>
                ((string *)&CreateRIAttribs.ShadingRateTexelSize.height,
                 (char (*) [65])"Unable to get render pass for the currently bound render targets");
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar7,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x78b);
      std::__cxx11::string::~string((string *)&CreateRIAttribs.ShadingRateTexelSize.height);
      this->m_vkRenderPass = (VkRenderPass)0x0;
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
    }
    else {
      pVVar9 = RenderPassVkImpl::GetVkRenderPass(this_02);
      this->m_vkRenderPass = pVVar9;
      RenderPassKey.Hash = (size_t)this->m_vkRenderPass;
      FBKey.ShadingRate = (VkImageView)0xffffffffffffffff;
      pVVar10 = FramebufferCache::GetFramebuffer
                          (this_00,(FramebufferCacheKey *)&RenderPassKey.Hash,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight
                           ,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                            m_FramebufferSlices);
      this->m_vkFramebuffer = pVVar10;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::ChooseRenderPassAndFramebuffer()
{
    FramebufferCache::FramebufferCacheKey FBKey;
    RenderPassCache::RenderPassCacheKey   RenderPassKey;
    if (m_pBoundDepthStencil)
    {
        ITexture* pDepthBuffer    = m_pBoundDepthStencil->GetTexture();
        FBKey.DSV                 = m_pBoundDepthStencil->GetVulkanImageView();
        RenderPassKey.DSVFormat   = m_pBoundDepthStencil->GetDesc().Format;
        RenderPassKey.ReadOnlyDSV = m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
        RenderPassKey.SampleCount = static_cast<Uint8>(pDepthBuffer->GetDesc().SampleCount);
    }
    else
    {
        FBKey.DSV               = VK_NULL_HANDLE;
        RenderPassKey.DSVFormat = TEX_FORMAT_UNKNOWN;
    }

    FBKey.NumRenderTargets         = m_NumBoundRenderTargets;
    RenderPassKey.NumRenderTargets = static_cast<Uint8>(m_NumBoundRenderTargets);

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewVkImpl* pRTVVk = m_pBoundRenderTargets[rt])
        {
            ITexture* pRenderTarget      = pRTVVk->GetTexture();
            FBKey.RTVs[rt]               = pRTVVk->GetVulkanImageView();
            RenderPassKey.RTVFormats[rt] = pRenderTarget->GetDesc().Format;
            if (RenderPassKey.SampleCount == 0)
                RenderPassKey.SampleCount = static_cast<Uint8>(pRenderTarget->GetDesc().SampleCount);
            else
                VERIFY(RenderPassKey.SampleCount == pRenderTarget->GetDesc().SampleCount, "Inconsistent sample count");
        }
        else
        {
            FBKey.RTVs[rt]               = VK_NULL_HANDLE;
            RenderPassKey.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;
        }
    }

    if (RenderPassKey.SampleCount == 0)
        RenderPassKey.SampleCount = static_cast<Uint8>(m_FramebufferSamples);

    if (m_pBoundShadingRateMap)
    {
        FBKey.ShadingRate       = m_pBoundShadingRateMap.RawPtr<TextureViewVkImpl>()->GetVulkanImageView();
        RenderPassKey.EnableVRS = true;
    }
    else
    {
        FBKey.ShadingRate       = VK_NULL_HANDLE;
        RenderPassKey.EnableVRS = false;
    }

    FramebufferCache* FBCache = m_pDevice->GetFramebufferCache();
    RenderPassCache*  RPCache = m_pDevice->GetImplicitRenderPassCache();
    if (FBCache != nullptr && RPCache != nullptr)
    {
        if (RenderPassVkImpl* pRenderPass = RPCache->GetRenderPass(RenderPassKey))
        {
            m_vkRenderPass         = pRenderPass->GetVkRenderPass();
            FBKey.Pass             = m_vkRenderPass;
            FBKey.CommandQueueMask = ~Uint64{0};
            m_vkFramebuffer        = FBCache->GetFramebuffer(FBKey, m_FramebufferWidth, m_FramebufferHeight, m_FramebufferSlices);
        }
        else
        {
            UNEXPECTED("Unable to get render pass for the currently bound render targets");
            m_vkRenderPass  = VK_NULL_HANDLE;
            m_vkFramebuffer = VK_NULL_HANDLE;
        }
    }
    else
    {
        FramebufferCache::CreateDyanmicRenderInfoAttribs CreateRIAttribs;
        CreateRIAttribs.Extent   = {m_FramebufferWidth, m_FramebufferHeight};
        CreateRIAttribs.Layers   = m_FramebufferSlices;
        CreateRIAttribs.ViewMask = 0;
        if (m_pBoundDepthStencil)
        {
            const TEXTURE_FORMAT        DepthStencilFmt = m_pBoundDepthStencil->GetTexture()->GetDesc().Format;
            const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(DepthStencilFmt);

            CreateRIAttribs.UseDepthAttachment   = true;
            CreateRIAttribs.UseStencilAttachment = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
            CreateRIAttribs.ReadOnlyDepthStencil = (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        }
        if (m_pBoundShadingRateMap)
        {
            const TextureDesc& ShadingRateDesc = m_pBoundShadingRateMap->GetTexture()->GetDesc();
            // Framebuffer size may not be an integer multiple of the shading rate texel size
            // Shading rate texel size be a power of two
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06149
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06152
            CreateRIAttribs.ShadingRateTexelSize.width  = AlignUpToPowerOfTwo(m_FramebufferWidth / ShadingRateDesc.Width);
            CreateRIAttribs.ShadingRateTexelSize.height = AlignUpToPowerOfTwo(m_FramebufferHeight / ShadingRateDesc.Height);
        }

        VERIFY(!m_DynamicRenderingInfo || !m_DynamicRenderingInfo->HasClears(), "There are pending clears in the dynamic render pass");
        m_DynamicRenderingInfo = FramebufferCache::CreateDyanmicRenderInfo(FBKey, CreateRIAttribs);
    }
}